

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

void findEventBits(int pi)

{
  evtCallback_t *peVar1;
  evtCallback_t **ppeVar2;
  uint32_t bits;
  
  bits = 0;
  ppeVar2 = &geCallBackFirst;
  while (peVar1 = *ppeVar2, peVar1 != (evtCallback_t *)0x0) {
    if (peVar1->pi == pi) {
      bits = bits | 1 << ((byte)peVar1->event & 0x1f);
    }
    ppeVar2 = &peVar1->next;
  }
  if (bits == gEventBits[pi]) {
    return;
  }
  gEventBits[pi] = bits;
  pigpio_command(pi,0x73,gPigHandle[pi],bits,1);
  return;
}

Assistant:

static void findEventBits(int pi)
{
   evtCallback_t *ep;
   uint32_t bits = 0;

   ep = geCallBackFirst;

   while (ep)
   {
      if (ep->pi == pi) bits |= (1<<(ep->event));
      ep = ep->next;
   }

   if (bits != gEventBits[pi])
   {
      gEventBits[pi] = bits;
      pigpio_command(pi, PI_CMD_EVM, gPigHandle[pi], gEventBits[pi], 1);
   }
}